

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

bool __thiscall ASigil::HandlePickup(ASigil *this,AInventory *item)

{
  int iVar1;
  player_t *ppVar2;
  AInventory *pAVar3;
  PClass *pPVar4;
  undefined1 uVar5;
  int iVar6;
  undefined4 extraout_var;
  bool bVar8;
  PClass *pPVar7;
  
  pPVar4 = RegistrationInfo.MyClass;
  pPVar7 = (item->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar7 == (PClass *)0x0) {
    iVar6 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
    pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
    (item->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
  }
  bVar8 = pPVar7 != (PClass *)0x0;
  if (pPVar7 != pPVar4 && bVar8) {
    do {
      pPVar7 = pPVar7->ParentClass;
      bVar8 = pPVar7 != (PClass *)0x0;
      if (pPVar7 == pPVar4) break;
    } while (pPVar7 != (PClass *)0x0);
  }
  if (bVar8) {
    iVar6 = *(int *)((long)&item[1].super_AActor.Angles.CamRoll.Degrees + 4);
    iVar1 = *(int *)&(this->super_AWeapon).field_0x584;
    bVar8 = true;
    if (iVar1 < iVar6) {
      *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
      (this->super_AWeapon).super_AInventory.Icon.texnum = (item->Icon).texnum;
      ppVar2 = ((this->super_AWeapon).super_AInventory.Owner.field_0.p)->player;
      if ((ppVar2 != (player_t *)0x0) && ((ASigil *)ppVar2->ReadyWeapon == this)) {
        this->DownPieces = iVar1;
        ppVar2->PendingWeapon = &this->super_AWeapon;
      }
      *(int *)&(this->super_AWeapon).field_0x584 = iVar6;
    }
  }
  else {
    pAVar3 = (this->super_AWeapon).super_AInventory.super_AActor.Inventory.field_0.p;
    if (pAVar3 != (AInventory *)0x0) {
      if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        uVar5 = (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x37])
                          (pAVar3,item);
        return (bool)uVar5;
      }
      (this->super_AWeapon).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool ASigil::HandlePickup (AInventory *item)
{
	if (item->IsKindOf (RUNTIME_CLASS(ASigil)))
	{
		int otherPieces = static_cast<ASigil*>(item)->NumPieces;
		if (otherPieces > NumPieces)
		{
			item->ItemFlags |= IF_PICKUPGOOD;
			Icon = item->Icon;
			// If the player is holding the Sigil right now, drop it and bring
			// it back with the new piece(s) in view.
			if (Owner->player != NULL && Owner->player->ReadyWeapon == this)
			{
				DownPieces = NumPieces;
				Owner->player->PendingWeapon = this;
			}
			NumPieces = otherPieces;
		}
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}